

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O2

void __thiscall bloaty::Regex::Regex(Regex *this,Regex *from)

{
  void *pvVar1;
  uint uVar2;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__Regex_005fd580;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->pattern_).ptr_ =
       (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->pattern_,
               (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->pattern_).ptr_);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  (this->replacement_).ptr_ =
       (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar2 & 2) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->replacement_,
               (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->replacement_).ptr_);
  }
  return;
}

Assistant:

Regex::Regex(const Regex& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  pattern_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_pattern()) {
    pattern_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.pattern_);
  }
  replacement_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_replacement()) {
    replacement_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.replacement_);
  }
  // @@protoc_insertion_point(copy_constructor:bloaty.Regex)
}